

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

bool Imath_3_2::(anonymous_namespace)::jacobiRotation<1,3,0,2,float>
               (Matrix44<float> *A,Matrix44<float> *V,Vec4<float> *Z,float tol)

{
  float fVar1;
  float *pfVar2;
  float *pfVar3;
  Vec4<float> *in_RDX;
  int __x;
  Matrix44<float> *in_RDI;
  Matrix44<float> *pMVar4;
  float in_XMM0_Da;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar5;
  float extraout_XMM0_Da_01;
  float fVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  float nu2_1;
  float nu1_1;
  float *offd2_1;
  float *offd1_1;
  float nu2;
  float nu1;
  float *offd2;
  float *offd1;
  float h;
  float tau;
  float s;
  float c;
  float t;
  float rho;
  float mu2;
  float mu1;
  float z;
  float y;
  float x;
  float tau_00;
  
  pfVar2 = Matrix44<float>::operator[](in_RDI,1);
  fVar5 = pfVar2[1];
  pfVar2 = Matrix44<float>::operator[](in_RDI,1);
  fVar1 = pfVar2[3];
  pMVar4 = in_RDI;
  pfVar2 = Matrix44<float>::operator[](in_RDI,3);
  fVar7 = pfVar2[3];
  __x = (int)pMVar4;
  std::abs(__x);
  tau_00 = extraout_XMM0_Da;
  std::abs(__x);
  if (in_XMM0_Da * extraout_XMM0_Da_00 < tau_00) {
    fVar5 = (fVar7 - fVar5) / (fVar1 * 2.0);
    std::abs(__x);
    dVar9 = std::sqrt((double)(ulong)(uint)(fVar5 * fVar5 + 1.0));
    fVar6 = (float)(~-(uint)(fVar5 < 0.0) & 0x3f800000 | -(uint)(fVar5 < 0.0) & 0xbf800000) /
            (extraout_XMM0_Da_01 + SUB84(dVar9,0));
    dVar9 = std::sqrt((double)(ulong)(uint)(fVar6 * fVar6 + 1.0));
    fVar5 = 1.0 / SUB84(dVar9,0);
    fVar7 = fVar5 * fVar6;
    fVar8 = fVar7 / (fVar5 + 1.0);
    fVar6 = fVar6 * fVar1;
    pfVar2 = Vec4<float>::operator[](in_RDX,1);
    *pfVar2 = *pfVar2 - fVar6;
    pfVar2 = Vec4<float>::operator[](in_RDX,3);
    *pfVar2 = fVar6 + *pfVar2;
    pfVar2 = Matrix44<float>::operator[](in_RDI,1);
    pfVar2[1] = pfVar2[1] - fVar6;
    pfVar2 = Matrix44<float>::operator[](in_RDI,3);
    pfVar2[3] = fVar6 + pfVar2[3];
    pfVar2 = Matrix44<float>::operator[](in_RDI,1);
    pfVar2[3] = 0.0;
    pfVar2 = Matrix44<float>::operator[](in_RDI,0);
    pfVar2 = pfVar2 + 1;
    pfVar3 = Matrix44<float>::operator[](in_RDI,0);
    pfVar3 = pfVar3 + 3;
    fVar5 = *pfVar2;
    fVar1 = *pfVar3;
    *pfVar2 = -fVar7 * (fVar8 * fVar5 + fVar1) + *pfVar2;
    *pfVar3 = fVar7 * (-fVar8 * fVar1 + fVar5) + *pfVar3;
    pfVar2 = Matrix44<float>::operator[](in_RDI,1);
    pfVar2 = pfVar2 + 2;
    pfVar3 = Matrix44<float>::operator[](in_RDI,2);
    pfVar3 = pfVar3 + 3;
    fVar5 = *pfVar2;
    fVar1 = *pfVar3;
    *pfVar2 = -fVar7 * (fVar8 * fVar5 + fVar1) + *pfVar2;
    *pfVar3 = fVar7 * (-fVar8 * fVar1 + fVar5) + *pfVar3;
    jacobiRotateRight<1,3,Imath_3_2::Matrix44<float>>
              ((Matrix44<float> *)CONCAT44(fVar5,fVar1),in_XMM0_Da,tau_00);
  }
  else {
    pfVar2 = Matrix44<float>::operator[](in_RDI,1);
    pfVar2[3] = 0.0;
  }
  return true;
}

Assistant:

bool
jacobiRotation (Matrix44<T>& A, Matrix44<T>& V, Vec4<T>& Z, const T tol)
{
    const T x = A[j][j];
    const T y = A[j][k];
    const T z = A[k][k];

    const T mu1 = z - x;
    const T mu2 = T (2) * y;

    // Let's see if rho^(-1) = mu2 / mu1 is less than tol
    // This test also checks if rho^2 will overflow
    // when tol^(-1) < sqrt(std::numeric_limits<T>::max()).
    if (std::abs (mu2) <= tol * std::abs (mu1))
    {
        A[j][k] = 0;
        return true;
    }

    const T rho = mu1 / mu2;
    const T t   = (rho < 0 ? T (-1) : T (1)) /
                (std::abs (rho) + std::sqrt (1 + rho * rho));
    const T c   = T (1) / std::sqrt (T (1) + t * t);
    const T s   = c * t;
    const T tau = s / (T (1) + c);
    const T h   = t * y;

    Z[j] -= h;
    Z[k] += h;
    A[j][j] -= h;
    A[k][k] += h;
    A[j][k] = 0;

    {
        T&      offd1 = l1 < j ? A[l1][j] : A[j][l1];
        T&      offd2 = l1 < k ? A[l1][k] : A[k][l1];
        const T nu1   = offd1;
        const T nu2   = offd2;
        offd1 -= s * (nu2 + tau * nu1);
        offd2 += s * (nu1 - tau * nu2);
    }

    {
        T&      offd1 = l2 < j ? A[l2][j] : A[j][l2];
        T&      offd2 = l2 < k ? A[l2][k] : A[k][l2];
        const T nu1   = offd1;
        const T nu2   = offd2;
        offd1 -= s * (nu2 + tau * nu1);
        offd2 += s * (nu1 - tau * nu2);
    }

    jacobiRotateRight<j, k> (V, s, tau);

    return true;
}